

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::reshapeTest(ViewTest *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  runtime_error *this_00;
  size_t sVar4;
  reference pfVar5;
  reference pfVar6;
  logic_error *plVar7;
  ulong uVar8;
  ulong uVar9;
  code *pcVar10;
  undefined *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  View<float,_false,_std::allocator<unsigned_long>_> v;
  size_t newShape_1 [2];
  View<float,_false,_std::allocator<unsigned_long>_> w;
  View<float,_false,_std::allocator<unsigned_long>_> x;
  size_t shape_1 [3];
  size_t base [3];
  size_t newShape [2];
  size_t shape [3];
  float data [24];
  undefined1 local_1b8 [16];
  size_t *local_1a8;
  size_t local_190;
  ulong local_188;
  CoordinateOrder local_180;
  bool local_17c;
  unsigned_long local_178 [2];
  undefined1 local_168 [16];
  unsigned_long *local_158;
  unsigned_long *local_150;
  unsigned_long *local_148;
  size_t local_140;
  ulong local_138;
  CoordinateOrder local_130;
  bool local_12c;
  View<float,_false,_std::allocator<unsigned_long>_> local_128;
  unsigned_long local_e8 [4];
  unsigned_long local_c8 [4];
  unsigned_long local_a8 [6];
  float local_78 [24];
  
  lVar3 = 0;
  auVar12 = _DAT_00238070;
  auVar13 = _DAT_00238080;
  do {
    uVar8 = auVar13._0_8_;
    if ((long)uVar8 < 0) {
      fVar14 = (float)((ulong)(auVar13._0_4_ & 1) | uVar8 >> 1);
      fVar14 = fVar14 + fVar14;
    }
    else {
      fVar14 = (float)(long)uVar8;
    }
    uVar1 = auVar13._8_8_;
    if (auVar13._12_4_ < 0) {
      fVar15 = (float)((ulong)(auVar13._8_4_ & 1) | uVar1 >> 1);
      fVar15 = fVar15 + fVar15;
    }
    else {
      fVar15 = (float)(long)uVar1;
    }
    uVar9 = auVar12._0_8_;
    if ((long)uVar9 < 0) {
      fVar16 = (float)((ulong)(auVar12._0_4_ & 1) | uVar9 >> 1);
      fVar16 = fVar16 + fVar16;
    }
    else {
      fVar16 = (float)(long)uVar9;
    }
    uVar2 = auVar12._8_8_;
    if (auVar12._12_4_ < 0) {
      fVar17 = (float)((ulong)(auVar12._8_4_ & 1) | uVar2 >> 1);
      fVar17 = fVar17 + fVar17;
    }
    else {
      fVar17 = (float)(long)uVar2;
    }
    local_78[lVar3] = fVar14;
    local_78[lVar3 + 1] = fVar15;
    local_78[lVar3 + 2] = fVar16;
    local_78[lVar3 + 3] = fVar17;
    lVar3 = lVar3 + 4;
    auVar13._0_8_ = uVar8 + 4;
    auVar13._8_8_ = uVar1 + 4;
    auVar12._0_8_ = uVar9 + 4;
    auVar12._8_8_ = uVar2 + 4;
  } while (lVar3 != 0x18);
  local_a8[2] = 2;
  local_a8[3] = 4;
  local_a8[4] = 3;
  local_1b8._0_8_ = local_78;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1b8 + 8),local_a8 + 2,local_a8 + 5,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_168);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8);
  local_168._0_8_ = local_1b8._0_8_;
  local_158 = (unsigned_long *)0x0;
  local_140 = 0;
  if (local_190 != 0) {
    local_158 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                          ((new_allocator<unsigned_long> *)(local_168 + 8),local_190 * 3,(void *)0x0
                          );
    local_140 = local_190;
  }
  local_150 = local_158 + local_140;
  local_148 = local_150 + local_140;
  local_138 = local_188;
  local_130 = local_180;
  local_12c = local_17c;
  memcpy(local_158,local_1a8,local_140 * 0x18);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_168);
  local_a8[0] = 4;
  local_a8[1] = 6;
  andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)local_1b8,local_a8,local_a8 + 2);
  if ((float *)local_1b8._0_8_ == (float *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    pcVar10 = std::runtime_error::~runtime_error;
    puVar11 = &std::runtime_error::typeinfo;
  }
  else {
    if (local_190 == 2) {
      if (local_188 != 0x18) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"test failed.");
        __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar4 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,0);
      if (sVar4 != 4) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"test failed.");
        __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar4 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,1);
      if (sVar4 != 6) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"test failed.");
        __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8);
      if (local_17c == false) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"test failed.");
        __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_128.data_._0_4_ = 0;
      pfVar5 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<float,int,false,std::allocator<unsigned_long>>
                         ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,
                          (int *)&local_128);
      local_128.data_ = (pointer)((ulong)local_128.data_._4_4_ << 0x20);
      pfVar6 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<float,int,false,std::allocator<unsigned_long>>
                         ((View<float,_false,_std::allocator<unsigned_long>_> *)local_168,
                          (int *)&local_128);
      if (pfVar5 != pfVar6) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"test failed.");
        __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      if (local_188 != 0) {
        sVar4 = 0;
        do {
          pfVar5 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,sVar4)
          ;
          fVar14 = *pfVar5;
          pfVar5 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<float,_false,_std::allocator<unsigned_long>_> *)local_168,sVar4)
          ;
          if ((fVar14 != *pfVar5) || (NAN(fVar14) || NAN(*pfVar5))) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar7,"test failed.");
            __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          sVar4 = sVar4 + 1;
        } while (sVar4 < local_188);
      }
      local_c8[0] = 0;
      local_c8[1] = 1;
      local_c8[2] = 1;
      local_e8[0] = 2;
      local_e8[1] = 3;
      local_e8[2] = 2;
      local_178[0] = 3;
      local_178[1] = 4;
      local_128.data_ = (pointer)0x0;
      local_128.geometry_.shape_ = (size_t *)0x0;
      local_128.geometry_.shapeStrides_ = (size_t *)0x0;
      local_128.geometry_.strides_ = (size_t *)0x0;
      local_128.geometry_.dimension_ = 0;
      local_128.geometry_.size_ = 0;
      local_128.geometry_.coordinateOrder_ = LastMajorOrder;
      local_128.geometry_.isSimple_ = true;
      andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_128);
      andres::View<float,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
                ((View<float,false,std::allocator<unsigned_long>> *)local_1b8,local_c8,local_e8,
                 &local_128);
      andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
                ((View<float,false,std::allocator<unsigned_long>> *)&local_128,local_178,
                 (unsigned_long *)local_168);
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar7,"test failed.");
      __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error((logic_error *)this_00,"test failed.");
    pcVar10 = std::logic_error::~logic_error;
    puVar11 = &std::logic_error::typeinfo;
  }
  __cxa_throw(this_00,puVar11,pcVar10);
}

Assistant:

void ViewTest::reshapeTest()
{
    float data[24];
    for(std::size_t j=0; j<24; ++j) {
        data[j] = static_cast<float>(j);
    }
    std::size_t shape[] = {2, 4, 3};
    andres::View<float, false> v(&shape[0], &shape[3], data);
    andres::View<float, false> w = v; // copy
    
    std::size_t newShape[] = {4, 6};
    v.reshape(&newShape[0], &newShape[2]);

    test(v.dimension() == 2);
    test(v.size() == 24);
    test(v.shape(0) == 4);
    test(v.shape(1) == 6);
    test(v.isSimple());
    test(&v(0) == &w(0));
    for(std::size_t j=0; j<v.size(); ++j) {
        test(v(j) == w(j));
    }

    if(!andres::MARRAY_NO_DEBUG) {
        // negative test
        std::size_t base[] = {0, 1, 1};
        std::size_t shape[] = {2, 3, 2};
        std::size_t newShape[] = {3, 4};
        andres::View<float, false> x = v.view(base, shape);
        try {
            x.reshape(&newShape[0], &newShape[2]);
            test(0 == 1); // reshape should have thrown runtime_error
        }
        catch(std::runtime_error&) {}
    }
}